

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

TELEMETRY_MESSENGER_HANDLE
telemetry_messenger_create
          (TELEMETRY_MESSENGER_CONFIG *messenger_config,
          pfTransport_GetOption_Product_Info_Callback prod_info_cb,void *prod_info_ctx)

{
  LOGGER_LOG p_Var1;
  TELEMETRY_MESSENGER_HANDLE messenger_handle;
  STRING_HANDLE pSVar2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TELEMETRY_MESSENGER_HANDLE handle;
  void *prod_info_ctx_local;
  pfTransport_GetOption_Product_Info_Callback prod_info_cb_local;
  TELEMETRY_MESSENGER_CONFIG *messenger_config_local;
  
  if (messenger_config == (TELEMETRY_MESSENGER_CONFIG *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (TELEMETRY_MESSENGER_HANDLE)0x0;
    }
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
              ,"telemetry_messenger_create",0x765,1,
              "telemetry_messenger_create failed (messenger_config is NULL)");
    return (TELEMETRY_MESSENGER_HANDLE)0x0;
  }
  if (messenger_config->device_id == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (TELEMETRY_MESSENGER_HANDLE)0x0;
    }
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
              ,"telemetry_messenger_create",0x76a,1,
              "telemetry_messenger_create failed (messenger_config->device_id is NULL)");
    return (TELEMETRY_MESSENGER_HANDLE)0x0;
  }
  if (messenger_config->iothub_host_fqdn == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (TELEMETRY_MESSENGER_HANDLE)0x0;
    }
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
              ,"telemetry_messenger_create",0x76f,1,
              "telemetry_messenger_create failed (messenger_config->iothub_host_fqdn is NULL)");
    return (TELEMETRY_MESSENGER_HANDLE)0x0;
  }
  messenger_handle = (TELEMETRY_MESSENGER_HANDLE)malloc(200);
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_create",0x778,1,
                "telemetry_messenger_create failed (messenger_config->wait_to_send_list is NULL)");
    }
  }
  else {
    memset(messenger_handle,0,200);
    messenger_handle->state = TELEMETRY_MESSENGER_STATE_STOPPED;
    messenger_handle->message_sender_current_state = MESSAGE_SENDER_STATE_IDLE;
    messenger_handle->message_sender_previous_state = MESSAGE_SENDER_STATE_IDLE;
    messenger_handle->message_receiver_current_state = MESSAGE_RECEIVER_STATE_IDLE;
    messenger_handle->message_receiver_previous_state = MESSAGE_RECEIVER_STATE_IDLE;
    messenger_handle->event_send_retry_limit = 10;
    messenger_handle->event_send_timeout_secs = 600;
    messenger_handle->last_message_sender_state_change_time = -1;
    messenger_handle->last_message_receiver_state_change_time = -1;
    pSVar2 = STRING_construct(messenger_config->device_id);
    messenger_handle->device_id = pSVar2;
    if (pSVar2 == (STRING_HANDLE)0x0) {
      l = (LOGGER_LOG)0x0;
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"telemetry_messenger_create",0x78a,1,
                  "telemetry_messenger_create failed (device_id could not be copied; STRING_construct failed)"
                 );
      }
    }
    else {
      if (messenger_config->module_id != (char *)0x0) {
        pSVar2 = STRING_construct(messenger_config->module_id);
        messenger_handle->module_id = pSVar2;
        if (pSVar2 == (STRING_HANDLE)0x0) {
          l = (LOGGER_LOG)0x0;
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                      ,"telemetry_messenger_create",0x78f,1,
                      "telemetry_messenger_create failed (module_id could not be copied; STRING_construct failed)"
                     );
          }
          goto LAB_00144ec0;
        }
      }
      pSVar2 = STRING_construct(messenger_config->iothub_host_fqdn);
      messenger_handle->iothub_host_fqdn = pSVar2;
      if (pSVar2 == (STRING_HANDLE)0x0) {
        l = (LOGGER_LOG)0x0;
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"telemetry_messenger_create",0x794,1,
                    "telemetry_messenger_create failed (iothub_host_fqdn could not be copied; STRING_construct failed)"
                   );
        }
      }
      else {
        pSVar3 = singlylinkedlist_create();
        messenger_handle->waiting_to_send = pSVar3;
        if (pSVar3 == (SINGLYLINKEDLIST_HANDLE)0x0) {
          l = (LOGGER_LOG)0x0;
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                      ,"telemetry_messenger_create",0x799,1,
                      "telemetry_messenger_create failed (singlylinkedlist_create failed to create wait_to_send_list)"
                     );
          }
        }
        else {
          pSVar3 = singlylinkedlist_create();
          messenger_handle->in_progress_list = pSVar3;
          if (pSVar3 == (SINGLYLINKEDLIST_HANDLE)0x0) {
            l = (LOGGER_LOG)0x0;
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                        ,"telemetry_messenger_create",0x79e,1,
                        "telemetry_messenger_create failed (singlylinkedlist_create failed to create in_progress_list)"
                       );
            }
          }
          else {
            messenger_handle->on_state_changed_callback =
                 messenger_config->on_state_changed_callback;
            messenger_handle->on_state_changed_context = messenger_config->on_state_changed_context;
            messenger_handle->prod_info_cb = prod_info_cb;
            messenger_handle->prod_info_ctx = prod_info_ctx;
            l = (LOGGER_LOG)messenger_handle;
          }
        }
      }
    }
  }
LAB_00144ec0:
  if (l == (LOGGER_LOG)0x0) {
    telemetry_messenger_destroy(messenger_handle);
  }
  return (TELEMETRY_MESSENGER_HANDLE)l;
}

Assistant:

TELEMETRY_MESSENGER_HANDLE telemetry_messenger_create(const TELEMETRY_MESSENGER_CONFIG* messenger_config, pfTransport_GetOption_Product_Info_Callback prod_info_cb, void* prod_info_ctx)
{
    TELEMETRY_MESSENGER_HANDLE handle;

    if (messenger_config == NULL)
    {
        handle = NULL;
        LogError("telemetry_messenger_create failed (messenger_config is NULL)");
    }
    else if (messenger_config->device_id == NULL)
    {
        handle = NULL;
        LogError("telemetry_messenger_create failed (messenger_config->device_id is NULL)");
    }
    else if (messenger_config->iothub_host_fqdn == NULL)
    {
        handle = NULL;
        LogError("telemetry_messenger_create failed (messenger_config->iothub_host_fqdn is NULL)");
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* instance;

        if ((instance = (TELEMETRY_MESSENGER_INSTANCE*)malloc(sizeof(TELEMETRY_MESSENGER_INSTANCE))) == NULL)
        {
            handle = NULL;
            LogError("telemetry_messenger_create failed (messenger_config->wait_to_send_list is NULL)");
        }
        else
        {
            memset(instance, 0, sizeof(TELEMETRY_MESSENGER_INSTANCE));
            instance->state = TELEMETRY_MESSENGER_STATE_STOPPED;
            instance->message_sender_current_state = MESSAGE_SENDER_STATE_IDLE;
            instance->message_sender_previous_state = MESSAGE_SENDER_STATE_IDLE;
            instance->message_receiver_current_state = MESSAGE_RECEIVER_STATE_IDLE;
            instance->message_receiver_previous_state = MESSAGE_RECEIVER_STATE_IDLE;
            instance->event_send_retry_limit = DEFAULT_EVENT_SEND_RETRY_LIMIT;
            instance->event_send_timeout_secs = DEFAULT_EVENT_SEND_TIMEOUT_SECS;
            instance->last_message_sender_state_change_time = INDEFINITE_TIME;
            instance->last_message_receiver_state_change_time = INDEFINITE_TIME;

            if ((instance->device_id = STRING_construct(messenger_config->device_id)) == NULL)
            {
                handle = NULL;
                LogError("telemetry_messenger_create failed (device_id could not be copied; STRING_construct failed)");
            }
            else if ((messenger_config->module_id != NULL) && ((instance->module_id = STRING_construct(messenger_config->module_id)) == NULL))
            {
                handle = NULL;
                LogError("telemetry_messenger_create failed (module_id could not be copied; STRING_construct failed)");
            }
            else if ((instance->iothub_host_fqdn = STRING_construct(messenger_config->iothub_host_fqdn)) == NULL)
            {
                handle = NULL;
                LogError("telemetry_messenger_create failed (iothub_host_fqdn could not be copied; STRING_construct failed)");
            }
            else if ((instance->waiting_to_send = singlylinkedlist_create()) == NULL)
            {
                handle = NULL;
                LogError("telemetry_messenger_create failed (singlylinkedlist_create failed to create wait_to_send_list)");
            }
            else if ((instance->in_progress_list = singlylinkedlist_create()) == NULL)
            {
                handle = NULL;
                LogError("telemetry_messenger_create failed (singlylinkedlist_create failed to create in_progress_list)");
            }
            else
            {
                instance->on_state_changed_callback = messenger_config->on_state_changed_callback;

                instance->on_state_changed_context = messenger_config->on_state_changed_context;

                instance->prod_info_cb = prod_info_cb;
                instance->prod_info_ctx = prod_info_ctx;

                handle = (TELEMETRY_MESSENGER_HANDLE)instance;
            }
        }

        if (handle == NULL)
        {
            telemetry_messenger_destroy((TELEMETRY_MESSENGER_HANDLE)instance);
        }
    }

    return handle;
}